

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_compress.c
# Opt level: O0

void HUF_buildCTableFromTree
               (HUF_CElt *CTable,nodeElt *huffNode,int nonNullRank,U32 maxSymbolValue,U32 maxNbBits)

{
  U16 UVar1;
  U16 local_6e;
  U16 local_68;
  U16 min;
  int alphabetSize;
  U16 valPerRank [13];
  U16 nbPerRank [13];
  int n;
  U32 maxNbBits_local;
  U32 maxSymbolValue_local;
  int nonNullRank_local;
  nodeElt *huffNode_local;
  HUF_CElt *CTable_local;
  
  memset(valPerRank + 0xc,0,0x1a);
  memset(&local_68,0,0x1a);
  for (stack0xffffffffffffffd8 = 0; (int)stack0xffffffffffffffd8 <= nonNullRank;
      register0x00000000 = stack0xffffffffffffffd8 + 1) {
    valPerRank[(ulong)huffNode[(int)stack0xffffffffffffffd8].nbBits + 0xc] =
         valPerRank[(ulong)huffNode[(int)stack0xffffffffffffffd8].nbBits + 0xc] + 1;
  }
  local_6e = 0;
  for (unique0x10000206 = maxNbBits; 0 < (int)stack0xffffffffffffffd8;
      register0x00000000 = stack0xffffffffffffffd8 - 1) {
    (&local_68)[(int)stack0xffffffffffffffd8] = local_6e;
    local_6e = (U16)((int)(uint)(ushort)(local_6e +
                                        valPerRank[(long)(int)stack0xffffffffffffffd8 + 0xc]) >> 1);
  }
  for (stack0xffffffffffffffd8 = 0; (int)stack0xffffffffffffffd8 < (int)(maxSymbolValue + 1);
      register0x00000000 = stack0xffffffffffffffd8 + 1) {
    CTable[huffNode[(int)stack0xffffffffffffffd8].byte].nbBits =
         huffNode[(int)stack0xffffffffffffffd8].nbBits;
  }
  for (stack0xffffffffffffffd8 = 0; (int)stack0xffffffffffffffd8 < (int)(maxSymbolValue + 1);
      register0x00000000 = stack0xffffffffffffffd8 + 1) {
    UVar1 = (&local_68)[CTable[(int)stack0xffffffffffffffd8].nbBits];
    (&local_68)[CTable[(int)stack0xffffffffffffffd8].nbBits] = UVar1 + 1;
    CTable[(int)stack0xffffffffffffffd8].val = UVar1;
  }
  return;
}

Assistant:

static void HUF_buildCTableFromTree(HUF_CElt* CTable, nodeElt const* huffNode, int nonNullRank, U32 maxSymbolValue, U32 maxNbBits)
{
    /* fill result into ctable (val, nbBits) */
    int n;
    U16 nbPerRank[HUF_TABLELOG_MAX+1] = {0};
    U16 valPerRank[HUF_TABLELOG_MAX+1] = {0};
    int const alphabetSize = (int)(maxSymbolValue + 1);
    for (n=0; n<=nonNullRank; n++)
        nbPerRank[huffNode[n].nbBits]++;
    /* determine starting value per rank */
    {   U16 min = 0;
        for (n=(int)maxNbBits; n>0; n--) {
            valPerRank[n] = min;      /* get starting value within each rank */
            min += nbPerRank[n];
            min >>= 1;
    }   }
    for (n=0; n<alphabetSize; n++)
        CTable[huffNode[n].byte].nbBits = huffNode[n].nbBits;   /* push nbBits per symbol, symbol order */
    for (n=0; n<alphabetSize; n++)
        CTable[n].val = valPerRank[CTable[n].nbBits]++;   /* assign value within rank, symbol order */
}